

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

string * __thiscall
cmGlobalUnixMakefileGenerator3::ConvertToMakefilePath
          (string *__return_storage_ptr__,cmGlobalUnixMakefileGenerator3 *this,string *path)

{
  string *path_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  anon_unknown.dwarf_12c3f0a::ConvertToMakefilePathForUnix(__return_storage_ptr__,path);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalUnixMakefileGenerator3::ConvertToMakefilePath(
  std::string const& path) const
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  if (!this->ForceUnixPaths) {
    return ConvertToMakefilePathForWindows(path);
  }
#endif
  return ConvertToMakefilePathForUnix(path);
}